

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O1

void __thiscall spvtools::opt::MemPass::RemoveBlock(MemPass *this,iterator *bi)

{
  BasicBlock *pBVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var2;
  iterator __position;
  pointer puVar3;
  MemPass *pMVar4;
  char cVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  _Any_data *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  MemPass *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  pBVar1 = (((bi->iterator_)._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_88 = &local_58;
  pcStack_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:401:24)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:401:24)>
             ::_M_manager;
  uStack_80 = 0;
  pcStack_70 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  _Var2._M_head_impl =
       *(Instruction **)
        &(pBVar1->label_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ;
  local_58._M_unused._0_8_ = (undefined8)pBVar1;
  local_58._8_8_ = this;
  if ((tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
      _Var2._M_head_impl != (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) {
    local_90._M_head_impl = _Var2._M_head_impl;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:401:24)>
    ::_M_invoke(local_88,&local_90._M_head_impl);
  }
  pIVar6 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_60 = this;
  if ((pIVar6 != (Instruction *)0x0) &&
     ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar6 == (Instruction *)0x0) break;
      pIVar7 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_90._M_head_impl = pIVar6;
      if (local_78 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      if ((pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar7 = (Instruction *)0x0;
      }
      cVar5 = (*pcStack_70)(&local_88,&local_90);
      pIVar6 = pIVar7;
    } while (cVar5 != '\0');
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  pMVar4 = local_60;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  IRContext::KillInst((pMVar4->super_Pass).context_,
                      (Instruction *)
                      (pBVar1->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     );
  __position._M_current = (bi->iterator_)._M_current;
  puVar3 = (bi->container_->
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::_M_erase(bi->container_,__position);
  (bi->iterator_)._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       ((long)__position._M_current +
       ((long)(bi->container_->
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start - (long)puVar3));
  return;
}

Assistant:

void MemPass::RemoveBlock(Function::iterator* bi) {
  auto& rm_block = **bi;

  // Remove instructions from the block.
  rm_block.ForEachInst([&rm_block, this](Instruction* inst) {
    // Note that we do not kill the block label instruction here. The label
    // instruction is needed to identify the block, which is needed by the
    // removal of phi operands.
    if (inst != rm_block.GetLabelInst()) {
      context()->KillInst(inst);
    }
  });

  // Remove the label instruction last.
  auto label = rm_block.GetLabelInst();
  context()->KillInst(label);

  *bi = bi->Erase();
}